

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O3

void __thiscall
rcg::Device::Device(Device *this,shared_ptr<rcg::Interface> *_parent,
                   shared_ptr<const_rcg::GenTLWrapper> *_gentl,char *_id)

{
  char *pcVar1;
  
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
  super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<rcg::Device>)._M_weak_this.
  super___weak_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  memset(&this->event_buffer,0,0x98);
  (this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_parent->super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->parent).super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(_parent->super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
  ;
  (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(_gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  pcVar1 = (char *)(this->id)._M_string_length;
  strlen(_id);
  std::__cxx11::string::_M_replace((ulong)&this->id,0,pcVar1,(ulong)_id);
  this->n_open = 0;
  this->dev = (void *)0x0;
  this->rp = (void *)0x0;
  this->event = (void *)0x0;
  return;
}

Assistant:

Device::Device(const std::shared_ptr<Interface> &_parent,
               const std::shared_ptr<const GenTLWrapper> &_gentl, const char *_id)
{
  parent=_parent;
  gentl=_gentl;
  id=_id;

  n_open=0;
  dev=0;
  rp=0;
  event=0;
}